

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
               (CodedInputStream *input,int32_t *value)

{
  byte bVar1;
  byte *pbVar2;
  uint32_t first_byte_or_zero;
  ulong uVar3;
  bool bVar4;
  
  pbVar2 = input->buffer_;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar3 = (ulong)bVar1;
    first_byte_or_zero = (uint32_t)bVar1;
    if (-1 < (char)bVar1) {
      input->buffer_ = pbVar2 + 1;
      bVar4 = true;
      goto LAB_00275983;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  uVar3 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
  bVar4 = -1 < (long)uVar3;
LAB_00275983:
  if (bVar4 != false) {
    *value = -((uint)uVar3 & 1) ^ (uint)(uVar3 >> 1) & 0x7fffffff;
  }
  return bVar4;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<int32_t, WireFormatLite::TYPE_SINT32>(
    io::CodedInputStream* input, int32_t* value) {
  uint32_t temp;
  if (!input->ReadVarint32(&temp)) return false;
  *value = ZigZagDecode32(temp);
  return true;
}